

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,DryHandler *handler)

{
  byte *pbVar1;
  Ch CVar2;
  byte bVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  Ch *pCVar7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte bVar11;
  Ch *pCVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  
  CVar2 = *is->src_;
  if (CVar2 == '\"') {
    ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
              (this,is,handler,false);
    return;
  }
  if (CVar2 == '[') {
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x327,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    is->src_ = is->src_ + 1;
    SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
    if (*(int *)(this + 0x30) == 0) {
      pCVar7 = is->src_;
      if (*pCVar7 == ']') {
LAB_001018f9:
        is->src_ = pCVar7 + 1;
      }
      else {
        do {
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pCVar7 = is->src_;
          if (*pCVar7 != ',') {
            if (*pCVar7 != ']') {
              pCVar12 = is->head_;
              *(undefined4 *)(this + 0x30) = 7;
              *(long *)(this + 0x38) = (long)pCVar7 - (long)pCVar12;
              return;
            }
            goto LAB_001018f9;
          }
          is->src_ = pCVar7 + 1;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
        } while (*(int *)(this + 0x30) == 0);
      }
    }
    return;
  }
  if (CVar2 == 'f') {
    pCVar7 = is->src_;
    if (*pCVar7 != 'f') {
      __assert_fail("is.Peek() == \'f\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x371,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    pCVar12 = pCVar7 + 1;
    is->src_ = pCVar12;
    if (pCVar7[1] == 'a') {
      pCVar12 = pCVar7 + 2;
      is->src_ = pCVar12;
      if (pCVar7[2] == 'l') {
        pCVar12 = pCVar7 + 3;
        is->src_ = pCVar12;
        if (pCVar7[3] == 's') {
          pCVar12 = pCVar7 + 4;
          is->src_ = pCVar12;
          if (pCVar7[4] == 'e') {
            is->src_ = pCVar7 + 5;
            return;
          }
        }
      }
    }
    if (*(int *)(this + 0x30) == 0) {
      pCVar7 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pCVar12 - (long)pCVar7;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x379,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  if (CVar2 == '{') {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x2e3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    is->src_ = is->src_ + 1;
    SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
    if (*(int *)(this + 0x30) == 0) {
      pCVar7 = is->src_;
      if (*pCVar7 == '}') {
LAB_001017b1:
        is->src_ = pCVar7 + 1;
      }
      else {
        while (*is->src_ == '\"') {
          ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pCVar7 = is->src_;
          if (*pCVar7 != ':') {
            lVar8 = (long)pCVar7 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_0010187e;
          }
          is->src_ = pCVar7 + 1;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pCVar7 = is->src_;
          if (*pCVar7 != ',') {
            if (*pCVar7 != '}') {
              lVar8 = (long)pCVar7 - (long)is->head_;
              *(undefined4 *)(this + 0x30) = 6;
              goto LAB_0010187e;
            }
            goto LAB_001017b1;
          }
          is->src_ = pCVar7 + 1;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        lVar8 = (long)is->src_ - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 4;
LAB_0010187e:
        *(long *)(this + 0x38) = lVar8;
      }
    }
    return;
  }
  if (CVar2 == 't') {
    pCVar7 = is->src_;
    if (*pCVar7 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x364,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    pCVar12 = pCVar7 + 1;
    is->src_ = pCVar12;
    if (pCVar7[1] == 'r') {
      pCVar12 = pCVar7 + 2;
      is->src_ = pCVar12;
      if (pCVar7[2] == 'u') {
        pCVar12 = pCVar7 + 3;
        is->src_ = pCVar12;
        if (pCVar7[3] == 'e') {
          is->src_ = pCVar7 + 4;
          return;
        }
      }
    }
    if (*(int *)(this + 0x30) == 0) {
      pCVar7 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pCVar12 - (long)pCVar7;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x36c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  if (CVar2 == 'n') {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>(this,is,handler);
    return;
  }
  pbVar4 = is->src_;
  bVar3 = *pbVar4;
  pbVar10 = pbVar4;
  bVar11 = bVar3;
  if (bVar3 == 0x2d) {
    bVar11 = pbVar4[1];
    pbVar10 = pbVar4 + 1;
  }
  pCVar7 = is->head_;
  if (bVar11 == 0x30) {
    uVar14 = (uint)pbVar10[1];
    pbVar9 = pbVar10 + 1;
    auVar25 = ZEXT864(0) << 0x40;
    bVar5 = false;
    uVar17 = 0;
    bVar6 = false;
    uVar13 = 0;
    bVar22 = false;
    uVar19 = 0;
    goto LAB_00101b57;
  }
  if ((byte)(bVar11 - 0x31) < 9) {
    uVar13 = 0;
    uVar19 = bVar11 - 0x30;
    if (bVar3 == 0x2d) {
LAB_001019db:
      bVar11 = pbVar10[uVar13 + 1];
      uVar15 = (ulong)bVar11;
      if (9 < (byte)(bVar11 - 0x30)) goto LAB_00101aaf;
      if (uVar19 < 0xccccccc) {
LAB_001019f4:
        uVar13 = uVar13 + 1;
        uVar19 = uVar19 * 10 + -0x30 + (uint)bVar11;
        goto LAB_001019db;
      }
      uVar14 = uVar19;
      if (uVar19 != 0xccccccc) goto LAB_00101a59;
      if (bVar11 < 0x39) goto LAB_001019f4;
      uVar15 = 0x39;
      uVar14 = 0xccccccc;
LAB_00101a59:
      uVar19 = uVar14;
      pbVar9 = pbVar10 + uVar13 + 1;
      uVar17 = (ulong)uVar19;
      if (bVar3 == 0x2d) {
        while( true ) {
          uVar14 = (uint)uVar15;
          if (9 < (byte)((byte)uVar15 - 0x30)) break;
          if ((0xccccccccccccccb < uVar17) && (0x38 < (byte)uVar15 || uVar17 != 0xccccccccccccccc))
          goto LAB_00101b0d;
          uVar13 = (ulong)((int)uVar13 + 1);
          uVar16 = uVar15 & 0xf;
          uVar15 = (ulong)pbVar9[1];
          pbVar9 = pbVar9 + 1;
          uVar17 = uVar16 + uVar17 * 10;
        }
      }
      else {
        while( true ) {
          uVar14 = (uint)uVar15;
          if (9 < (byte)((byte)uVar15 - 0x30)) break;
          if ((0x1999999999999998 < uVar17) && (0x35 < (byte)uVar15 || uVar17 != 0x1999999999999999)
             ) goto LAB_00101b0d;
          uVar13 = (ulong)((int)uVar13 + 1);
          uVar16 = uVar15 & 0xf;
          uVar15 = (ulong)pbVar9[1];
          pbVar9 = pbVar9 + 1;
          uVar17 = uVar16 + uVar17 * 10;
        }
      }
      auVar25 = ZEXT864(0);
      bVar22 = true;
      bVar5 = false;
      bVar6 = false;
    }
    else {
      while( true ) {
        bVar11 = pbVar10[uVar13 + 1];
        uVar15 = (ulong)bVar11;
        if (9 < (byte)(bVar11 - 0x30)) break;
        if ((0x19999998 < uVar19) &&
           ((uVar14 = uVar19, uVar19 != 0x19999999 || (uVar14 = 0x19999999, 0x35 < bVar11))))
        goto LAB_00101a59;
        uVar13 = uVar13 + 1;
        uVar19 = uVar19 * 10 + -0x30 + (uint)bVar11;
      }
LAB_00101aaf:
      uVar14 = (uint)bVar11;
      pbVar9 = pbVar10 + uVar13 + 1;
      auVar25 = ZEXT864(0);
      bVar5 = false;
      uVar17 = 0;
      bVar6 = false;
      bVar22 = false;
    }
    goto LAB_00101b57;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 3;
  pbVar9 = pbVar10;
LAB_00101dbc:
  *(long *)(this + 0x38) = (long)pbVar10 - (long)pCVar7;
LAB_00101dc3:
  is->src_ = pbVar9;
  is->head_ = pCVar7;
  return;
LAB_00101b0d:
  auVar24 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,uVar17);
  while( true ) {
    uVar14 = (uint)uVar15;
    auVar25 = ZEXT1664(auVar24);
    if (9 < (byte)((char)uVar15 - 0x30U)) break;
    auVar26._0_8_ = (double)(int)(uVar14 - 0x30);
    auVar26._8_8_ = in_ZMM3._8_8_;
    uVar15 = (ulong)pbVar9[1];
    pbVar9 = pbVar9 + 1;
    auVar24 = vfmadd231sd_fma(auVar26,auVar24,ZEXT816(0x4024000000000000));
  }
  bVar5 = true;
  bVar6 = true;
  bVar22 = true;
LAB_00101b57:
  dVar23 = auVar25._0_8_;
  iVar18 = 0;
  if ((char)uVar14 == '.') {
    uVar14 = (uint)pbVar9[1];
    pbVar10 = pbVar9 + 1;
    if ((byte)(pbVar9[1] - 0x3a) < 0xf6) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                      ,0x627,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xe;
      pbVar9 = pbVar10;
      goto LAB_00101dbc;
    }
    iVar20 = 0;
    if (!bVar5) {
      if (!bVar22) {
        uVar17 = (ulong)uVar19;
      }
      iVar20 = 0;
      while (((0x2f < (byte)uVar14 && ((byte)uVar14 < 0x3a)) && (uVar17 >> 0x35 == 0))) {
        pbVar9 = pbVar10 + 1;
        iVar20 = iVar20 + -1;
        pbVar10 = pbVar10 + 1;
        uVar17 = (ulong)(uVar14 - 0x30) + uVar17 * 10;
        uVar13 = (ulong)((int)uVar13 + (uint)(uVar17 != 0));
        uVar14 = (uint)*pbVar9;
      }
      auVar24 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,uVar17);
      auVar25 = ZEXT1664(auVar24);
      bVar6 = true;
    }
    pbVar9 = pbVar10;
    while( true ) {
      auVar24 = auVar25._0_16_;
      dVar23 = auVar25._0_8_;
      if ((byte)uVar14 < 0x30) break;
      if (0x39 < (byte)uVar14) goto LAB_00101c7a;
      if ((int)uVar13 < 0x11) {
        iVar20 = iVar20 + -1;
        auVar27._0_8_ = (double)(int)(uVar14 - 0x30);
        auVar27._8_8_ = in_XMM4_Qb;
        auVar24 = vfmadd231sd_fma(auVar27,auVar24,ZEXT816(0x4024000000000000));
        if (0.0 < auVar24._0_8_) {
          uVar13 = (ulong)((int)uVar13 + 1);
        }
      }
      uVar14 = (uint)pbVar9[1];
      pbVar9 = pbVar9 + 1;
      auVar25 = ZEXT1664(auVar24);
    }
    iVar18 = 0;
LAB_00101d93:
    if ((bVar6 == false) ||
       (dVar23 = internal::StrtodNormalPrecision(dVar23,iVar18 + iVar20),
       dVar23 <= 1.79769313486232e+308)) goto LAB_00101dc3;
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x6ab,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
  }
  else {
    iVar20 = 0;
LAB_00101c7a:
    if ((uVar14 | 0x20) != 0x65) goto LAB_00101d93;
    uVar13 = (ulong)uVar19;
    if (bVar22) {
      uVar13 = uVar17;
    }
    bVar5 = true;
    if (bVar6) {
      bVar5 = bVar6;
    }
    bVar3 = pbVar9[1];
    bVar22 = bVar3 != 0x2b;
    if ((bVar22) && (bVar3 != 0x2d)) {
      pbVar10 = pbVar9 + 1;
      bVar22 = false;
    }
    else {
      bVar3 = pbVar9[2];
      pbVar10 = pbVar9 + 2;
    }
    if (9 < (byte)(bVar3 - 0x30)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                      ,0x67c,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xf;
      pbVar9 = pbVar10;
      goto LAB_00101dbc;
    }
    pbVar9 = pbVar10 + 1;
    iVar21 = bVar3 - 0x30;
    if (bVar22) {
      if (0 < iVar20) {
        __assert_fail("expFrac <= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                      ,0x667,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                     );
      }
      pbVar10 = pbVar9;
      while (pbVar9 = pbVar10, (byte)(*pbVar9 - 0x30) < 10) {
        iVar21 = iVar21 * 10 + -0x30 + (uint)*pbVar9;
        pbVar10 = pbVar9 + 1;
        if ((iVar20 + 0x7ffffff7) / 10 < iVar21) {
          do {
            pbVar1 = pbVar9 + 1;
            pbVar9 = pbVar9 + 1;
            pbVar10 = pbVar9;
          } while ((byte)(*pbVar1 - 0x30) < 10);
        }
      }
LAB_00101d6f:
      auVar24._8_8_ = in_XMM4_Qb;
      auVar24._0_8_ = in_XMM4_Qa;
      auVar24 = vcvtusi2sd_avx512f(auVar24,uVar13);
      iVar18 = -iVar21;
      if (!bVar22) {
        iVar18 = iVar21;
      }
      dVar23 = (double)((ulong)bVar6 * (long)dVar23 + (ulong)!bVar6 * auVar24._0_8_);
      bVar6 = bVar5;
      goto LAB_00101d93;
    }
    do {
      bVar3 = *pbVar9;
      if (9 < (byte)(bVar3 - 0x30)) goto LAB_00101d6f;
      pbVar9 = pbVar9 + 1;
      iVar21 = iVar21 * 10 + -0x30 + (uint)bVar3;
    } while (iVar21 <= 0x134 - iVar20);
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x677,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
  }
  *(undefined4 *)(this + 0x30) = 0xd;
  pbVar10 = pbVar4;
  goto LAB_00101dbc;
}

Assistant:

Ch Peek() const { return *src_; }